

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

int __thiscall QObject::receivers(QObject *this,char *signal)

{
  QObjectPrivate *this_00;
  __pointer_type pCVar1;
  bool bVar2;
  uint signalIndex;
  int iVar3;
  long lVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (signal == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    this_00 = (QObjectPrivate *)(this->d_ptr).d;
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QMetaObject::normalizedSignature((QByteArray *)&local_58,signal);
    pcVar5 = local_58.ptr;
    if (local_58.ptr == (char *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    iVar3 = 0;
    signalIndex = QObjectPrivate::signalIndex(this_00,pcVar5 + 1,(QMetaObject **)0x0);
    if (-1 < (int)signalIndex) {
      bVar2 = QObjectPrivate::isSignalConnected(this_00,signalIndex,true);
      if (bVar2) {
        iVar3 = 0;
        if (((this_00->super_QObjectData).field_0x30 & 8) == 0) {
          if (QAbstractDeclarativeData::receivers !=
              (_func_int_QAbstractDeclarativeData_ptr_QObject_ptr_int *)0x0 &&
              (this_00->field_3).currentChildBeingDeleted != (QObject *)0x0) {
            iVar3 = (*QAbstractDeclarativeData::receivers)
                              ((QAbstractDeclarativeData *)
                               (this_00->field_3).currentChildBeingDeleted,this,signalIndex);
          }
        }
        local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QMutexLocker<QBasicMutex>::QMutexLocker
                  ((QMutexLocker<QBasicMutex> *)local_38,
                   (QBasicMutex *)
                   ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
                   ((ulong)this & 0xffffffff) % 0x418));
        pCVar1 = (this_00->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>.
                 _q_value._M_b._M_p;
        if (((pCVar1 != (__pointer_type)0x0) &&
            (((__pointer_type)
             (pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value
             ._M_b)._M_p != (__pointer_type)0x0)) &&
           ((int)signalIndex <
            *(int *)((long)(pCVar1->signalVector).
                           super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b + 8
                    ))) {
          lVar4 = (long)(pCVar1->signalVector).
                        super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b +
                  (ulong)signalIndex * 0x10 + 0x10;
          while( true ) {
            lVar4 = *(long *)(lVar4 + 0x10);
            if (lVar4 == 0) break;
            iVar3 = (iVar3 + 1) - (uint)(*(long *)(lVar4 + 0x28) == 0);
          }
        }
        QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_38);
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QObject::receivers(const char *signal) const
{
    Q_D(const QObject);
    int receivers = 0;
    if (signal) {
        QByteArray signal_name = QMetaObject::normalizedSignature(signal);
        signal = signal_name;
#ifndef QT_NO_DEBUG
        if (!check_signal_macro(this, signal, "receivers", "bind"))
            return 0;
#endif
        signal++; // skip code
        int signal_index = d->signalIndex(signal);
        if (signal_index < 0) {
#ifndef QT_NO_DEBUG
            err_method_notfound(this, signal - 1, "receivers");
#endif
            return 0;
        }

        if (!d->isSignalConnected(signal_index))
            return receivers;

        if (!d->isDeletingChildren && d->declarativeData && QAbstractDeclarativeData::receivers) {
            receivers += QAbstractDeclarativeData::receivers(d->declarativeData, this,
                                                             signal_index);
        }

        QMutexLocker locker(signalSlotLock(this));
        QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
        if (cd && signal_index < cd->signalVectorCount()) {
            const QObjectPrivate::Connection *c = cd->signalVector.loadRelaxed()->at(signal_index).first.loadRelaxed();
            while (c) {
                receivers += c->receiver.loadRelaxed() ? 1 : 0;
                c = c->nextConnectionList.loadRelaxed();
            }
        }
    }
    return receivers;
}